

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall
TimesAll<0,0,0>::propagate_xy_max<0,0>
          (TimesAll<0,_0,_0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,
          int64_t z_min,int64_t z_max)

{
  bool bVar1;
  long *plVar2;
  int64_t iVar3;
  Lit *pLVar4;
  anon_union_8_2_743a5d44_for_Reason_0 in_R9;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  Reason m_r;
  int64_t m_v;
  Clause *reason;
  int64_t u_max_new;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined1 channel;
  IntView<0> *in_stack_ffffffffffffff50;
  IntView<0> *this_00;
  IntView<0> *this_01;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff60;
  long local_90;
  Reason local_78;
  IntView<0> *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Clause *local_58;
  long local_50;
  long local_48;
  IntView<0> *local_40 [8];
  
  local_40[0] = (IntView<0> *)0x0;
  if (((long)in_R9 < 0) && (0 < (long)in_stack_00000008)) {
    local_48 = -in_stack_00000010;
    plVar2 = std::max<long>(&local_48,&stack0x00000010);
    local_40[0] = (IntView<0> *)*plVar2;
    plVar2 = std::max<long>((long *)local_40,&stack0x00000018);
    local_40[0] = (IntView<0> *)*plVar2;
    local_50 = -in_stack_00000018;
    plVar2 = std::max<long>((long *)local_40,&local_50);
    local_40[0] = (IntView<0> *)*plVar2;
  }
  else {
    if ((long)in_stack_00000008 < 0) {
      local_90 = in_stack_00000010;
    }
    else {
      local_90 = in_stack_00000018;
    }
    in_stack_ffffffffffffff60 = in_stack_00000008;
    if (0 < in_stack_00000010) {
      in_stack_ffffffffffffff60 = in_R9;
    }
    local_40[0] = (IntView<0> *)(local_90 / (long)in_stack_ffffffffffffff60._a);
  }
  this_01 = local_40[0];
  iVar3 = IntView<0>::getMax(in_stack_ffffffffffffff50);
  if ((long)this_01 < iVar3) {
    local_58 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_58 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      local_5c = (int)IntView<0>::getMinLit
                                ((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pLVar4->x = local_5c;
      local_60 = (int)IntView<0>::getMaxLit
                                ((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pLVar4->x = local_60;
      local_64 = (int)IntView<0>::getMinLit
                                ((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pLVar4->x = local_64;
      local_68 = (int)IntView<0>::getMaxLit
                                ((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pLVar4->x = local_68;
    }
    this_00 = local_40[0];
    if (local_40[0] == (IntView<0> *)0x0) {
      this_00 = (IntView<0> *)0xffffffffffffffff;
    }
    local_70 = this_00;
    bVar1 = IntView<0>::setMaxNotR
                      (this_00,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    channel = (undefined1)((uint)in_stack_ffffffffffffff4c >> 0x18);
    if (bVar1) {
      Reason::Reason(&local_78,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason(&local_78,local_58);
      }
      bVar1 = IntView<0>::setMax(this_01,(int64_t)this_00,(Reason)in_stack_ffffffffffffff60,
                                 (bool)channel);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate_xy_max(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// u <= floor(z / v)
		int64_t u_max_new = 0;
		if (v_min < 0 && v_max > 0) {
			// The domain of integer variable v contains -1 and 1
			u_max_new = std::max(-1 * z_min, z_min);
			u_max_new = std::max(u_max_new, z_max);
			u_max_new = std::max(u_max_new, -1 * z_max);
		} else {
			u_max_new = (v_max < 0 ? z_min : z_max) / (z_min > 0 ? v_min : v_max);
		}

		if (u_max_new < u.getMax()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMax, (u_max_new == 0 ? -1 : u_max_new), reason);
		}

		return true;
	}